

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O2

string * __thiscall
JFSON::(anonymous_namespace)::JsonParser::parse_string_abi_cxx11_
          (string *__return_storage_ptr__,JsonParser *this)

{
  string *out_00;
  byte bVar1;
  long *plVar2;
  string *psVar3;
  byte bVar4;
  long lVar5;
  JsonParser *pJVar6;
  uint uVar7;
  char c;
  char *err_ret;
  char *err_ret_00;
  char *err_ret_01;
  char *err_ret_02;
  char *err_ret_03;
  char *err_ret_04;
  string *psVar8;
  JsonParser *pJStack_d0;
  allocator local_b1;
  string esc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string out;
  string local_50;
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  pJStack_d0 = (JsonParser *)0xffffffffffffffff;
  do {
    plVar2 = *(long **)this;
    psVar8 = *(string **)(this + 8);
    psVar3 = (string *)plVar2[1];
    if (psVar8 == psVar3) {
      std::__cxx11::string::string
                ((string *)&esc,"unexpected end of input in string",(allocator *)&local_90);
      fail<char_const*>(this,&esc,err_ret);
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
LAB_00105f02:
      psVar8 = &esc;
LAB_00105f07:
      std::__cxx11::string::~string((string *)psVar8);
LAB_00105f0c:
      std::__cxx11::string::~string((string *)&out);
      return __return_storage_ptr__;
    }
    out_00 = (string *)((long)&(psVar8->_M_dataplus)._M_p + 1);
    *(string **)(this + 8) = out_00;
    lVar5 = *plVar2;
    bVar1 = *(byte *)((long)&(psVar8->_M_dataplus)._M_p + lVar5);
    if (bVar1 == 0x22) {
      anon_unknown_21::JsonParser::encode_utf8(pJStack_d0,(long)&out,out_00);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p == &out.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = out.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = out._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = out._M_string_length;
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      out._M_dataplus._M_p = (pointer)&out.field_2;
      goto LAB_00105f0c;
    }
    if (bVar1 < 0x20) {
      esc_abi_cxx11_(&local_50,(JFSON *)(ulong)(uint)(int)(char)bVar1,(char)out_00);
      std::operator+(&local_90,"unescaped ",&local_50);
      std::operator+(&esc,&local_90," in string");
      fail<char_const*>(this,&esc,err_ret_00);
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_b1);
      std::__cxx11::string::~string((string *)&esc);
      std::__cxx11::string::~string((string *)&local_90);
      psVar8 = &local_50;
      goto LAB_00105f07;
    }
    if (bVar1 == 0x5c) {
      if (out_00 == psVar3) {
        std::__cxx11::string::string
                  ((string *)&esc,"unexpected end of input in string",(allocator *)&local_90);
        fail<char_const*>(this,&esc,err_ret_01);
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
        goto LAB_00105f02;
      }
      psVar3 = (string *)((long)&(psVar8->_M_dataplus)._M_p + 2);
      *(string **)(this + 8) = psVar3;
      bVar1 = *(byte *)((long)&(psVar8->_M_dataplus)._M_p + lVar5 + 1);
      if (bVar1 != 0x75) {
        anon_unknown_21::JsonParser::encode_utf8(pJStack_d0,(long)&out,psVar3);
        bVar4 = (byte)(bVar1 + 0x9e) >> 1 | bVar1 * -0x80;
        if (((bVar4 < 10) && ((0x345U >> (bVar4 & 0x1f) & 1) != 0)) ||
           ((bVar1 - 0x22 < 0x3b &&
            ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)))) goto LAB_00105ce7;
        esc_abi_cxx11_(&local_90,(JFSON *)(ulong)(uint)(int)(char)bVar1,c);
        std::operator+(&esc,"invalid escape character ",&local_90);
        fail<char_const*>(this,&esc,err_ret_04);
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
        std::__cxx11::string::~string((string *)&esc);
        psVar8 = &local_90;
        goto LAB_00105f07;
      }
      std::__cxx11::string::substr((ulong)&esc,(ulong)plVar2);
      if (esc._M_string_length < 4) {
        std::operator+(&local_90,"bad \\u escape: ",&esc);
        fail<char_const*>(this,&local_90,err_ret_03);
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
LAB_00105ef8:
        std::__cxx11::string::~string((string *)&local_90);
        goto LAB_00105f02;
      }
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        if ((9 < (byte)(esc._M_dataplus._M_p[lVar5] - 0x30U)) &&
           ((uVar7 = (byte)esc._M_dataplus._M_p[lVar5] - 0x41, 0x25 < uVar7 ||
            ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) {
          std::operator+(&local_90,"bad \\u escape: ",&esc);
          fail<char_const*>(this,&local_90,err_ret_02);
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
          goto LAB_00105ef8;
        }
      }
      pJVar6 = (JsonParser *)strtol(esc._M_dataplus._M_p,(char **)0x0,0x10);
      if (((ulong)pJVar6 & 0xfffffffffffffc00) == 0xdc00 &&
          ((ulong)pJStack_d0 & 0xfffffffffffffc00) == 0xd800) {
        anon_unknown_21::JsonParser::encode_utf8
                  (pJVar6 + (long)pJStack_d0 * 0x20 + -0x1afee0,(long)&out,
                   (string *)0xfffffffffffffc00);
        pJStack_d0 = (JsonParser *)0xffffffffffffffff;
      }
      else {
        anon_unknown_21::JsonParser::encode_utf8(pJStack_d0,(long)&out,(string *)0xfffffffffffffc00)
        ;
        pJStack_d0 = pJVar6;
      }
      *(long *)(this + 8) = *(long *)(this + 8) + 4;
      std::__cxx11::string::~string((string *)&esc);
    }
    else {
      anon_unknown_21::JsonParser::encode_utf8(pJStack_d0,(long)&out,out_00);
LAB_00105ce7:
      std::__cxx11::string::push_back((char)&out);
      pJStack_d0 = (JsonParser *)0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

string parse_string() {
        string out;
        long last_escaped_codepoint = -1;
        while (true) {
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            char ch = str[i++];

            if (ch == '"') {
                encode_utf8(last_escaped_codepoint, out);
                return out;
            }

            if (in_range(ch, 0, 0x1f))
                return fail("unescaped " + esc(ch) + " in string", "");

            // The usual case: non-escaped characters
            if (ch != '\\') {
                encode_utf8(last_escaped_codepoint, out);
                last_escaped_codepoint = -1;
                out += ch;
                continue;
            }

            // Handle escapes
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            ch = str[i++];

            if (ch == 'u') {
                // Extract 4-byte escape sequence
                string esc = str.substr(i, 4);
                // Explicitly check length of the substring. The following loop
                // relies on std::string returning the terminating NUL when
                // accessing str[length]. Checking here reduces brittleness.
                if (esc.length() < 4) {
                    return fail("bad \\u escape: " + esc, "");
                }
                for (size_t j = 0; j < 4; j++) {
                    if (!in_range(esc[j], 'a', 'f') && !in_range(esc[j], 'A', 'F')
                            && !in_range(esc[j], '0', '9'))
                        return fail("bad \\u escape: " + esc, "");
                }

                long codepoint = strtol(esc.data(), nullptr, 16);

                // JSON specifies that characters outside the BMP shall be encoded as a pair
                // of 4-hex-digit \u escapes encoding their surrogate pair components. Check
                // whether we're in the middle of such a beast: the previous codepoint was an
                // escaped lead (high) surrogate, and this is a trail (low) surrogate.
                if (in_range(last_escaped_codepoint, 0xD800, 0xDBFF)
                        && in_range(codepoint, 0xDC00, 0xDFFF)) {
                    // Reassemble the two surrogate pairs into one astral-plane character, per
                    // the UTF-16 algorithm.
                    encode_utf8((((last_escaped_codepoint - 0xD800) << 10)
                                 | (codepoint - 0xDC00)) + 0x10000, out);
                    last_escaped_codepoint = -1;
                } else {
                    encode_utf8(last_escaped_codepoint, out);
                    last_escaped_codepoint = codepoint;
                }

                i += 4;
                continue;
            }

            encode_utf8(last_escaped_codepoint, out);
            last_escaped_codepoint = -1;

            if (ch == 'b') {
                out += '\b';
            } else if (ch == 'f') {
                out += '\f';
            } else if (ch == 'n') {
                out += '\n';
            } else if (ch == 'r') {
                out += '\r';
            } else if (ch == 't') {
                out += '\t';
            } else if (ch == '"' || ch == '\\' || ch == '/') {
                out += ch;
            } else {
                return fail("invalid escape character " + esc(ch), "");
            }
        }
    }